

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O2

result_t * exttposeWrapper(result_t *__return_storage_ptr__,string *s,shared_ptr<Env> *envptr)

{
  Env *env_00;
  args_t args_;
  Env env;
  undefined1 local_750 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_730;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_720;
  undefined8 local_718;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_700;
  undefined8 local_6f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6e0;
  undefined8 local_6d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6c0;
  undefined8 local_6b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_6a0;
  undefined8 local_698;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_690;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_680;
  undefined8 local_678;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_670;
  undefined8 local_660;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined1 local_640;
  undefined4 local_63c;
  undefined2 local_638;
  undefined4 local_628;
  undefined8 local_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_618;
  undefined8 local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_608;
  Env local_5f8;
  
  parse((string *)local_750);
  local_750._16_8_ = &local_730;
  local_750._24_8_ = 0;
  local_730._M_local_buf[0] = '\0';
  local_720 = &local_710;
  local_718 = 0;
  local_710._M_local_buf[0] = '\0';
  local_700 = &local_6f0;
  local_6f8 = 0;
  local_6f0._M_local_buf[0] = '\0';
  local_6e0 = &local_6d0;
  local_6d8 = 0;
  local_6d0._M_local_buf[0] = '\0';
  local_6c0 = &local_6b0;
  local_6b8 = 0;
  local_6b0._M_local_buf[0] = '\0';
  local_6a0 = &local_690;
  local_698 = 0;
  local_690._M_local_buf[0] = '\0';
  local_680 = &local_670;
  local_678 = 0;
  local_670._M_local_buf[0] = '\0';
  local_660 = 0;
  local_650 = 0x100000001;
  uStack_648 = 0x100000001;
  local_640 = 1;
  local_63c = 1;
  local_638 = 0;
  local_628 = 0;
  local_620 = 0x25a0000;
  local_618 = &local_608;
  local_610 = 0;
  local_608._M_local_buf[0] = '\0';
  ExttposeArgument::parse_args
            ((ExttposeArgument *)(local_750 + 0x10),local_750._0_4_,(char **)local_750._8_8_);
  env_00 = (envptr->super___shared_ptr<Env,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (env_00 == (Env *)0x0) {
    Env::Env(&local_5f8);
    exttposeFunc(__return_storage_ptr__,&local_5f8,(ExttposeArgument *)(local_750 + 0x10));
    Env::~Env(&local_5f8);
  }
  else {
    exttposeFunc(__return_storage_ptr__,env_00,(ExttposeArgument *)(local_750 + 0x10));
  }
  ExttposeArgument::~ExttposeArgument((ExttposeArgument *)(local_750 + 0x10));
  args_t::~args_t((args_t *)local_750);
  return __return_storage_ptr__;
}

Assistant:

result_t exttposeWrapper(const string &s, shared_ptr<Env>& envptr) {
    args_t args_ = parse(s);
    ExttposeArgument args;
    args.parse_args(args_.argc, args_.argv);
    if (envptr == nullptr) {
        Env env;
        return exttposeFunc(env, args);
    }
    else {
        return exttposeFunc(*envptr, args);
    }
}